

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

void __thiscall
soul::SourceCodeOperations::deleteText
          (SourceCodeOperations *this,CodeLocation *start,CodeLocation *end)

{
  SourceCodeText *o;
  SourceCodeText *o_00;
  string local_60;
  CodeLocation local_40;
  CodeLocation local_30;
  
  o = (start->sourceCode).object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_40.location.data = (start->location).data;
  o_00 = (end->sourceCode).object;
  if (o_00 != (SourceCodeText *)0x0) {
    (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
  }
  local_30.location.data = (end->location).data;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40.sourceCode.object = o;
  local_30.sourceCode.object = o_00;
  replaceText(this,&local_40,&local_30,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return;
}

Assistant:

void SourceCodeOperations::addProcessor (AST::ProcessorBase&)
{
    // TODO
}